

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void conn_report_connect_stats(Curl_easy *data,connectdata *conn)

{
  Curl_cfilter *pCVar1;
  curltime timestamp;
  curltime timestamp_00;
  long local_40;
  curltime appconnected;
  curltime connected;
  Curl_cfilter *cf;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pCVar1 = conn->cfilter[0];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    memset(&appconnected.tv_usec,0,0x10);
    (*pCVar1->cft->query)(pCVar1,data,4,(int *)0x0,&appconnected.tv_usec);
    if ((appconnected._8_8_ != 0) || ((int)connected.tv_sec != 0)) {
      timestamp.tv_usec = (int)connected.tv_sec;
      timestamp.tv_sec = appconnected._8_8_;
      timestamp._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_CONNECT,timestamp);
    }
    memset(&local_40,0,0x10);
    (*pCVar1->cft->query)(pCVar1,data,5,(int *)0x0,&local_40);
    if ((local_40 != 0) || ((int)appconnected.tv_sec != 0)) {
      timestamp_00.tv_usec = (int)appconnected.tv_sec;
      timestamp_00.tv_sec = local_40;
      timestamp_00._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_APPCONNECT,timestamp_00);
    }
  }
  return;
}

Assistant:

static void conn_report_connect_stats(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  struct Curl_cfilter *cf = conn->cfilter[FIRSTSOCKET];
  if(cf) {
    struct curltime connected;
    struct curltime appconnected;

    memset(&connected, 0, sizeof(connected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_CONNECT, NULL, &connected);
    if(connected.tv_sec || connected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_CONNECT, connected);

    memset(&appconnected, 0, sizeof(appconnected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_APPCONNECT, NULL, &appconnected);
    if(appconnected.tv_sec || appconnected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_APPCONNECT, appconnected);
  }
}